

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformBufferBindingCase::testUniformBuffers
          (UniformBufferBindingCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int ndx_1;
  int ndx;
  long lVar2;
  GLuint buffers [2];
  StateQueryMemoryWriteGuard<int> boundBuffer;
  GLuint uniformIndices [2];
  char *uniformNames [2];
  GLuint local_68 [2];
  StateQueryMemoryWriteGuard<int> local_60;
  GLuint local_50 [2];
  char *local_48;
  char *pcStack_40;
  
  local_48 = "input1";
  pcStack_40 = "input2";
  local_50[0] = 0;
  local_50[1] = 0;
  this_00 = &(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glGetUniformIndices
            (this_00,(this->super_UniformBufferCase).m_program,2,&local_48,local_50);
  glu::CallLogWrapper::glGenBuffers(this_00,2,local_68);
  lVar2 = 0;
  do {
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,local_68[lVar2]);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x20,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,local_50[lVar2],local_68[lVar2]);
    ApiCase::expectError((ApiCase *)this,0);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    local_60.m_preguard = -0x21212122;
    local_60.m_value = -0x21212122;
    local_60.m_postguard = -0x21212122;
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8a28,local_50[lVar2],&local_60.m_value);
    bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&local_60,
                       (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
    if (bVar1) {
      checkIntEquals((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx,local_60.m_value,local_68[lVar2]);
    }
    ApiCase::expectError((ApiCase *)this,0);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,local_68);
  return;
}

Assistant:

void testUniformBuffers (void)
	{
		const char* uniformNames[] =
		{
			"input1",
			"input2"
		};
		GLuint uniformIndices[2] = {0};
		glGetUniformIndices(m_program, 2, uniformNames, uniformIndices);

		GLuint buffers[2];
		glGenBuffers(2, buffers);

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			glBindBuffer(GL_UNIFORM_BUFFER, buffers[ndx]);
			glBufferData(GL_UNIFORM_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
			glBindBufferBase(GL_UNIFORM_BUFFER, uniformIndices[ndx], buffers[ndx]);
			expectError(GL_NO_ERROR);
		}

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint> boundBuffer;
			glGetIntegeri_v(GL_UNIFORM_BUFFER_BINDING, uniformIndices[ndx], &boundBuffer);

			if (boundBuffer.verifyValidity(m_testCtx))
				checkIntEquals(m_testCtx, boundBuffer, buffers[ndx]);
			expectError(GL_NO_ERROR);
		}

		glDeleteBuffers(2, buffers);
	}